

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall
PDA::Transducer::Grammar::Rule::addChains<wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>
          (Rule *this,wchar_t (*first) [4],wchar_t (*rest) [5],wchar_t (*rest_1) [7],
          wchar_t (*rest_2) [7])

{
  allocator<wchar_t> local_71;
  wstring local_70;
  Chain local_50;
  wchar_t (*local_30) [7];
  wchar_t (*rest_local_2) [7];
  wchar_t (*rest_local_1) [7];
  wchar_t (*rest_local) [5];
  wchar_t (*first_local) [4];
  Rule *this_local;
  
  local_30 = rest_2;
  rest_local_2 = rest_1;
  rest_local_1 = (wchar_t (*) [7])rest;
  rest_local = (wchar_t (*) [5])first;
  first_local = &this->m_left;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_70,*first,&local_71);
  Chain::Chain(&local_50,&local_70);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  push_back(&this->m_chains,&local_50);
  Chain::~Chain(&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_70);
  std::allocator<wchar_t>::~allocator(&local_71);
  addChains<wchar_t[5],wchar_t[7],wchar_t[7]>
            (this,(wchar_t (*) [5])rest_local_1,rest_local_2,local_30);
  return;
}

Assistant:

void addChains(const First &first, const Rest&... rest)
        {
            m_chains.push_back(Chain(first));
            addChains(rest...);
        }